

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_perform_user(connectdata *conn)

{
  char *local_30;
  CURLcode result;
  connectdata *conn_local;
  
  if ((*(uint *)&(conn->bits).field_0x4 >> 8 & 1) == 0) {
    state(conn,POP3_STOP);
    conn_local._4_4_ = CURLE_OK;
  }
  else {
    if (conn->user == (char *)0x0) {
      local_30 = "";
    }
    else {
      local_30 = conn->user;
    }
    conn_local._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"USER %s",local_30);
    if (conn_local._4_4_ == CURLE_OK) {
      state(conn,POP3_USER);
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode pop3_perform_user(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;

  /* Check we have a username and password to authenticate with and end the
     connect phase if we don't */
  if(!conn->bits.user_passwd) {
    state(conn, POP3_STOP);

    return result;
  }

  /* Send the USER command */
  result = Curl_pp_sendf(&conn->proto.pop3c.pp, "USER %s",
                         conn->user ? conn->user : "");
  if(!result)
    state(conn, POP3_USER);

  return result;
}